

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isalpha.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  iVar1 = isalpha(0x61);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1a,"isalpha( \'a\' )");
  }
  iVar1 = isalpha(0x7a);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1b,"isalpha( \'z\' )");
  }
  iVar1 = isalpha(0x20);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1c,"! isalpha( \' \' )");
  }
  iVar1 = isalpha(0x31);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1d,"! isalpha( \'1\' )");
  }
  iVar1 = isalpha(0x40);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1e,"! isalpha( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isalpha( 'a' ) );
    TESTCASE( isalpha( 'z' ) );
    TESTCASE( ! isalpha( ' ' ) );
    TESTCASE( ! isalpha( '1' ) );
    TESTCASE( ! isalpha( '@' ) );
    return TEST_RESULTS;
}